

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_unpause(Curl_easy *data)

{
  byte bVar1;
  uint uVar2;
  int type;
  size_t sVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t sVar6;
  dynbuf *pdVar7;
  long lVar8;
  ulong uVar9;
  dynbuf *pdVar10;
  tempbuf writebuf [3];
  dynbuf local_a8;
  int local_88;
  byte abStack_84 [84];
  
  uVar2 = (data->state).tempcount;
  if (uVar2 == 0) {
    CVar4 = CURLE_OK;
  }
  else {
    if ((data->state).tempcount != 0) {
      pdVar10 = &(data->state).tempwrite[0].b;
      pdVar7 = &local_a8;
      uVar9 = 0;
      do {
        pdVar7[1].bufr = pdVar10[1].bufr;
        pcVar5 = pdVar10->bufr;
        sVar6 = pdVar10->leng;
        sVar3 = pdVar10->toobig;
        pdVar7->allc = pdVar10->allc;
        pdVar7->toobig = sVar3;
        pdVar7->bufr = pcVar5;
        pdVar7->leng = sVar6;
        Curl_dyn_init(pdVar10,0x4000000);
        uVar9 = uVar9 + 1;
        pdVar7 = (dynbuf *)&pdVar7[1].leng;
        pdVar10 = (dynbuf *)&pdVar10[1].leng;
      } while (uVar9 < (data->state).tempcount);
    }
    (data->state).tempcount = 0;
    lVar8 = 0;
    CVar4 = CURLE_OK;
    do {
      pdVar10 = (dynbuf *)((long)&local_a8.bufr + lVar8);
      if (CVar4 == CURLE_OK) {
        type = *(int *)((long)&local_88 + lVar8);
        bVar1 = abStack_84[lVar8];
        pcVar5 = Curl_dyn_ptr(pdVar10);
        sVar6 = Curl_dyn_len(pdVar10);
        CVar4 = chop_write(data,type,(bVar1 & 1) == 0,pcVar5,sVar6);
      }
      Curl_dyn_free(pdVar10);
      lVar8 = lVar8 + 0x28;
    } while ((ulong)(uVar2 + (uVar2 == 0)) * 0x28 != lVar8);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_client_unpause(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;

  if(data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i = 0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
    }
    data->state.tempcount = 0;

    for(i = 0; i < count; i++) {
      /* even if one function returns error, this loops through and frees
         all buffers */
      if(!result)
        result = chop_write(data, writebuf[i].type,
                            !writebuf[i].paused_body,
                            Curl_dyn_ptr(&writebuf[i].b),
                            Curl_dyn_len(&writebuf[i].b));
      Curl_dyn_free(&writebuf[i].b);
    }
  }
  return result;
}